

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O1

bool compactor_is_file_removed(char *filename)

{
  avl_node *paVar1;
  openfiles_elem_conflict query;
  char local_550 [1296];
  avl_node local_40 [2];
  
  strcpy(local_550,filename);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  paVar1 = avl_search(&openfiles,local_40,_compactor_cmp);
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  return paVar1 == (avl_node *)0x0;
}

Assistant:

bool compactor_is_file_removed(const char *filename)
{
    struct avl_node *a;
    struct openfiles_elem query;

    strcpy(query.filename, filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    mutex_unlock(&cpt_lock);
    if (a) {
        // exist .. old file is not removed yet
        return false;
    }
    return true;
}